

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O3

Aig_Man_t * Rtm_ManToAig(Rtm_Man_t *pRtm)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  undefined8 *puVar5;
  uint uVar6;
  int *pLatches;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  int nRegs;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  
  pVVar8 = pRtm->vObjs;
  iVar12 = pVVar8->nSize;
  lVar15 = (long)iVar12;
  pLatches = (int *)malloc(lVar15 * 8);
  if (lVar15 < 1) {
    nRegs = 0;
  }
  else {
    ppvVar3 = pVVar8->pArray;
    lVar9 = 0;
    nRegs = 0;
    do {
      pvVar4 = ppvVar3[lVar9];
      uVar13 = *(uint *)((long)pvVar4 + 8) >> 7 & 0xff;
      if (uVar13 != 0) {
        iVar1 = pRtm->vPis->nSize;
        iVar2 = *(int *)((long)pvVar4 + 0xc);
        uVar14 = 0;
        do {
          *(int *)((long)pLatches + uVar14 + (long)iVar2 * 8) = iVar1 + nRegs;
          nRegs = (*(uint *)((long)pvVar4 + uVar14 * 4 + 0x20) & 0xfff) + nRegs;
          uVar14 = uVar14 + 4;
        } while (uVar13 << 2 != uVar14);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar15);
  }
  p = Aig_ManStart(iVar12 + nRegs);
  if (pRtm->vObjs->nSize < 1) {
LAB_00614761:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  *(Aig_Obj_t **)*pRtm->vObjs->pArray = p->pConst1;
  pVVar8 = pRtm->vPis;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      puVar5 = (undefined8 *)pVVar8->pArray[lVar15];
      pAVar7 = Aig_ObjCreateCi(p);
      *puVar5 = pAVar7;
      lVar15 = lVar15 + 1;
      pVVar8 = pRtm->vPis;
    } while (lVar15 < pVVar8->nSize);
  }
  iVar12 = nRegs;
  if (0 < nRegs) {
    do {
      Aig_ObjCreateCi(p);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  pVVar8 = pRtm->vObjs;
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      Rtm_ManToAig_rec(p,pRtm,(Rtm_Obj_t *)pVVar8->pArray[lVar15],pLatches);
      lVar15 = lVar15 + 1;
      pVVar8 = pRtm->vObjs;
    } while (lVar15 < pVVar8->nSize);
  }
  pVVar10 = pRtm->vPos;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      Aig_ObjCreateCo(p,*pVVar10->pArray[lVar15]);
      lVar15 = lVar15 + 1;
      pVVar10 = pRtm->vPos;
    } while (lVar15 < pVVar10->nSize);
    pVVar8 = pRtm->vObjs;
  }
  if (0 < pVVar8->nSize) {
    lVar15 = 0;
    do {
      pvVar4 = pVVar8->pArray[lVar15];
      uVar13 = *(uint *)((long)pvVar4 + 8);
      if ((uVar13 & 0x7f80) != 0) {
        uVar14 = 0;
        do {
          uVar6 = *(uint *)((long)pvVar4 + uVar14 * 0x10 + 0x20);
          uVar11 = uVar6 & 0xfff;
          if (uVar11 != 0) {
            uVar17 = **(ulong **)((long)pvVar4 + uVar14 * 0x10 + 0x18);
            uVar13 = 0;
            iVar12 = -1;
            do {
              uVar6 = uVar6 >> 0xc;
              if (10 < uVar11) {
                uVar6 = pRtm->pExtra[(ulong)uVar6 + (long)((int)(uVar11 + iVar12) >> 4)];
              }
              uVar6 = uVar6 >> ((char)(uVar11 + iVar12) * '\x02' & 0x1fU) & 3;
              if (2 < uVar6 - 1) {
                __assert_fail("Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                              ,0x326,"Aig_Man_t *Rtm_ManToAig(Rtm_Man_t *)");
              }
              uVar16 = (ulong)(uVar6 == 2);
              Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar17 ^ uVar16));
              uVar6 = pLatches[(long)(int)uVar14 + (long)*(int *)((long)pvVar4 + 0xc) * 2] + uVar13;
              if (((int)uVar6 < 0) || (p->vCis->nSize <= (int)uVar6)) goto LAB_00614761;
              uVar17 = uVar16 ^ (ulong)p->vCis->pArray[uVar6];
              uVar13 = uVar13 + 1;
              uVar6 = *(uint *)((long)pvVar4 + uVar14 * 0x10 + 0x20);
              uVar11 = uVar6 & 0xfff;
              iVar12 = iVar12 + -1;
            } while (uVar13 < uVar11);
            uVar13 = *(uint *)((long)pvVar4 + 8);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (uVar13 >> 7 & 0xff));
        pVVar8 = pRtm->vObjs;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar8->nSize);
  }
  if (pLatches != (int *)0x0) {
    free(pLatches);
  }
  Aig_ManSetRegNum(p,nRegs);
  Aig_ManCleanup(p);
  iVar12 = Aig_ManCheck(p);
  if (iVar12 == 0) {
    puts("Rtm_ManToAig: The network check has failed.");
  }
  return p;
}

Assistant:

Aig_Man_t * Rtm_ManToAig( Rtm_Man_t * pRtm )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObjNew;
    Rtm_Obj_t * pObjRtm;
    Rtm_Edg_t * pEdge;
    int i, k, m, Val, nLatches, * pLatches;
    // count latches and mark the first latch on each edge
    pLatches = ABC_ALLOC( int, 2 * Vec_PtrSize(pRtm->vObjs) );
    nLatches = 0;
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        pLatches[2*pObjRtm->Id + k] = Vec_PtrSize(pRtm->vPis) + nLatches;
        nLatches += pEdge->nLats;
    }
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(pRtm->vObjs) + nLatches );
    // create PIs/POs and latches
    pObjRtm = (Rtm_Obj_t *)Vec_PtrEntry( pRtm->vObjs, 0 );
    pObjRtm->pCopy = Aig_ManConst1(pNew);
    Rtm_ManForEachPi( pRtm, pObjRtm, i )
        pObjRtm->pCopy = Aig_ObjCreateCi(pNew);
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCi(pNew);
    // create internal nodes
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
        Rtm_ManToAig_rec( pNew, pRtm, pObjRtm, pLatches );
    // create POs
    Rtm_ManForEachPo( pRtm, pObjRtm, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObjRtm->pCopy );
    // connect latches 
    Rtm_ManForEachObj( pRtm, pObjRtm, i )
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        if ( pEdge->nLats == 0 )
            continue;
        pObjNew = (Aig_Obj_t *)Rtm_ObjFanin( pObjRtm, k )->pCopy;
        for ( m = 0; m < (int)pEdge->nLats; m++ )
        {
            Val = Rtm_ObjGetOne( pRtm, pEdge, pEdge->nLats - 1 - m );
            assert( Val == RTM_VAL_ZERO || Val == RTM_VAL_ONE || Val == RTM_VAL_VOID );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
            Aig_ObjCreateCo( pNew, pObjNew );
            pObjNew = Aig_ManCi( pNew, pLatches[2*pObjRtm->Id + k] + m );
            pObjNew = Aig_NotCond( pObjNew, Val == RTM_VAL_ONE );
        }
//        assert( Aig_Regular(pObjNew)->nRefs > 0 );
    }
    ABC_FREE( pLatches );
    Aig_ManSetRegNum( pNew, nLatches );
    // remove useless nodes
    Aig_ManCleanup( pNew );
    if ( !Aig_ManCheck( pNew ) )
        printf( "Rtm_ManToAig: The network check has failed.\n" );
    return pNew;
}